

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O0

void __thiscall FIX44::MarketDataRequest::NoRelatedSym::NoRelatedSym(NoRelatedSym *this)

{
  undefined4 local_198 [2];
  undefined4 local_190;
  undefined4 local_188;
  undefined4 local_180;
  undefined4 local_178;
  undefined4 local_170;
  undefined4 local_168;
  undefined4 local_160;
  undefined4 local_158;
  undefined4 local_150;
  undefined4 local_148;
  undefined4 local_140;
  undefined4 local_138;
  undefined4 local_130;
  undefined4 local_128;
  undefined4 local_120;
  undefined4 local_118;
  undefined4 local_110;
  undefined4 local_108;
  undefined4 local_100;
  undefined4 local_f8;
  undefined4 local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined1 *local_60;
  Group *local_58;
  int local_4c;
  message_order *local_48;
  message_order local_30 [32];
  NoRelatedSym *local_10;
  NoRelatedSym *this_local;
  
  local_60 = (undefined1 *)local_198;
  local_68 = 0;
  local_70 = 0x22b;
  local_78 = 0x2c7;
  local_80 = 0x36a;
  local_88 = 0x369;
  local_90 = 0x36c;
  local_98 = 0x36b;
  local_a0 = 0x29b;
  local_a8 = 0x2b3;
  local_b0 = 0x15f;
  local_b8 = 0x15e;
  local_c0 = 0x6b;
  local_c8 = 0x15d;
  local_d0 = 0x15c;
  local_d8 = 0x6a;
  local_e0 = 0xcf;
  local_e8 = 0xdf;
  local_f0 = 0xe7;
  local_f8 = 0xce;
  local_100 = 0x3b3;
  local_108 = 0xca;
  local_110 = 0xf0;
  local_118 = 0x1d8;
  local_120 = 0x1d7;
  local_128 = 0x1d6;
  local_130 = 0x21f;
  local_138 = 0xff;
  local_140 = 0xe4;
  local_148 = 0xe3;
  local_150 = 0xe2;
  local_158 = 0xef;
  local_160 = 0xe1;
  local_168 = 0xe0;
  local_170 = 0xc9;
  local_178 = 0x21d;
  local_180 = 200;
  local_188 = 0x2fa;
  local_190 = 0xa7;
  local_198[0] = 0x1cd;
  local_48 = local_30;
  local_4c = 0x37;
  local_58 = &this->super_Group;
  local_10 = this;
  FIX::message_order::message_order(local_48,0x37,0x41,0x30,0x16,0x1cc);
  FIX::Group::Group(local_58,0x92,local_4c,local_48);
  FIX::message_order::~message_order(local_30);
  *(undefined ***)local_58 = &PTR__NoRelatedSym_0018a738;
  return;
}

Assistant:

NoRelatedSym() : FIX::Group(146,55,FIX::message_order(55,65,48,22,460,461,167,762,200,541,201,224,225,239,226,227,228,255,543,470,471,472,240,202,947,206,231,223,207,106,348,349,107,350,351,691,667,875,876,873,874,711,555,0)) {}